

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qrhiwidget.cpp
# Opt level: O1

void QRhiWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  QSize *pQVar2;
  bool bVar3;
  TextureFormat TVar4;
  QSize QVar5;
  void **ppvVar6;
  int iVar7;
  long in_FS_OFFSET;
  undefined4 local_4c;
  void *local_48;
  undefined4 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c);
  switch(_id) {
  case 0:
    iVar7 = 0;
    goto LAB_002b76b2;
  case 1:
    iVar7 = 1;
LAB_002b76b2:
    ppvVar6 = (void **)0x0;
    break;
  case 2:
    local_4c = *_a[1];
    puStack_40 = &local_4c;
    ppvVar6 = &local_48;
    local_48 = (void *)0x0;
    iVar7 = 2;
    break;
  case 3:
    local_4c = *_a[1];
    puStack_40 = &local_4c;
    ppvVar6 = &local_48;
    local_48 = (void *)0x0;
    iVar7 = 3;
    break;
  case 4:
    puStack_40 = (undefined4 *)_a[1];
    ppvVar6 = &local_48;
    local_48 = (void *)0x0;
    iVar7 = 4;
    break;
  case 5:
    puStack_40 = &local_4c;
    local_4c = CONCAT31(local_4c._1_3_,*_a[1]);
    ppvVar6 = &local_48;
    local_48 = (void *)0x0;
    iVar7 = 5;
    break;
  default:
    goto switchD_002b75ea_default;
  }
  QMetaObject::activate(_o,&staticMetaObject,iVar7,ppvVar6);
switchD_002b75ea_default:
  if (_c != ReadProperty) {
    if (_c != WriteProperty) {
      if (_c != IndexOfMethod) goto switchD_002b75ce_caseD_3;
      plVar1 = (long *)_a[1];
      if (((code *)*plVar1 == frameSubmitted) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 0;
        goto switchD_002b75ce_caseD_3;
      }
      if (((code *)*plVar1 == renderFailed) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 1;
        goto switchD_002b75ce_caseD_3;
      }
      if (((code *)*plVar1 == sampleCountChanged) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 2;
        goto switchD_002b75ce_caseD_3;
      }
      if (((code *)*plVar1 == colorBufferFormatChanged) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 3;
        goto switchD_002b75ce_caseD_3;
      }
      if (((code *)*plVar1 == fixedColorBufferSizeChanged) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 4;
        goto switchD_002b75ce_caseD_3;
      }
      if (((code *)*plVar1 == mirrorVerticallyChanged) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 5;
        goto switchD_002b75ce_caseD_3;
      }
      if (_c != WriteProperty) {
        if (_c != ReadProperty) goto switchD_002b75ce_caseD_3;
        goto switchD_002b75ce_caseD_1;
      }
    }
    goto switchD_002b75ce_caseD_2;
  }
switchD_002b75ce_caseD_1:
  if (3 < (uint)_id) goto LAB_002b7836;
  pQVar2 = (QSize *)*_a;
  switch(_id) {
  case 0:
    TVar4 = sampleCount((QRhiWidget *)_o);
    goto LAB_002b7832;
  case 1:
    TVar4 = colorBufferFormat((QRhiWidget *)_o);
LAB_002b7832:
    (pQVar2->wd).m_i = TVar4;
    break;
  case 2:
    QVar5 = fixedColorBufferSize((QRhiWidget *)_o);
    *pQVar2 = QVar5;
    break;
  case 3:
    bVar3 = isMirrorVerticallyEnabled((QRhiWidget *)_o);
    *(bool *)&(pQVar2->wd).m_i = bVar3;
  }
LAB_002b7836:
  if (_c == WriteProperty) {
switchD_002b75ce_caseD_2:
    if ((uint)_id < 4) {
      pQVar2 = (QSize *)*_a;
      switch(_id) {
      case 0:
        setSampleCount((QRhiWidget *)_o,(pQVar2->wd).m_i);
        break;
      case 1:
        setColorBufferFormat((QRhiWidget *)_o,(pQVar2->wd).m_i);
        break;
      case 2:
        setFixedColorBufferSize((QRhiWidget *)_o,*pQVar2);
        break;
      case 3:
        setMirrorVertically((QRhiWidget *)_o,SUB41((pQVar2->wd).m_i,0));
      }
    }
  }
switchD_002b75ce_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRhiWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QRhiWidget *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->frameSubmitted(); break;
        case 1: _t->renderFailed(); break;
        case 2: _t->sampleCountChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->colorBufferFormatChanged((*reinterpret_cast< std::add_pointer_t<TextureFormat>>(_a[1]))); break;
        case 4: _t->fixedColorBufferSizeChanged((*reinterpret_cast< std::add_pointer_t<QSize>>(_a[1]))); break;
        case 5: _t->mirrorVerticallyChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QRhiWidget::*)()>(_a, &QRhiWidget::frameSubmitted, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QRhiWidget::*)()>(_a, &QRhiWidget::renderFailed, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QRhiWidget::*)(int )>(_a, &QRhiWidget::sampleCountChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QRhiWidget::*)(TextureFormat )>(_a, &QRhiWidget::colorBufferFormatChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QRhiWidget::*)(const QSize & )>(_a, &QRhiWidget::fixedColorBufferSizeChanged, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QRhiWidget::*)(bool )>(_a, &QRhiWidget::mirrorVerticallyChanged, 5))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->sampleCount(); break;
        case 1: *reinterpret_cast<TextureFormat*>(_v) = _t->colorBufferFormat(); break;
        case 2: *reinterpret_cast<QSize*>(_v) = _t->fixedColorBufferSize(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->isMirrorVerticallyEnabled(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setSampleCount(*reinterpret_cast<int*>(_v)); break;
        case 1: _t->setColorBufferFormat(*reinterpret_cast<TextureFormat*>(_v)); break;
        case 2: _t->setFixedColorBufferSize(*reinterpret_cast<QSize*>(_v)); break;
        case 3: _t->setMirrorVertically(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}